

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proof.cc
# Opt level: O3

void __thiscall
gss::innards::Proof::mcs_bound
          (Proof *this,
          vector<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
          *partitions)

{
  long *plVar1;
  unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
  uVar2;
  _Head_base<0UL,_gss::innards::Proof::Imp_*,_false> _Var3;
  pointer pbVar4;
  uint uVar5;
  _Rb_tree_node_base *p_Var6;
  ostream *poVar7;
  _Rb_tree_node_base *p_Var8;
  long lVar9;
  ulong uVar10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_1;
  uint __len;
  long lVar11;
  ulong __val;
  type *__range3;
  pointer pbVar12;
  vector<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  *__range2;
  ulong uVar13;
  bool bVar14;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  to_sum;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  long local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)
             (((this->_imp)._M_t.
               super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
               ._M_t.
               super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
               .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->proof_stream
             )._M_t,"* failed bound\n",0xf);
  lVar11 = *(long *)partitions;
  if ((((this->_imp)._M_t.
        super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
        ._M_t.
        super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
        .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->recover_encoding ==
       true) && (lVar9 = *(long *)(partitions + 8), lVar11 != lVar9)) {
    do {
      for (p_Var6 = *(_Rb_tree_node_base **)(lVar11 + 0x48);
          p_Var6 != (_Rb_tree_node_base *)(lVar11 + 0x38);
          p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
        recover_injectivity_constraint(this,p_Var6[1]._M_color);
      }
      for (p_Var6 = *(_Rb_tree_node_base **)(lVar11 + 0x18);
          p_Var6 != (_Rb_tree_node_base *)(lVar11 + 8);
          p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
        recover_at_least_one_constraint(this,p_Var6[1]._M_color);
      }
      lVar11 = lVar11 + 0x60;
    } while (lVar11 != lVar9);
    lVar11 = *(long *)partitions;
  }
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar9 = *(long *)(partitions + 8);
  if (lVar11 != lVar9) {
    local_38 = lVar9;
    do {
      if (*(ulong *)(lVar11 + 0x58) < *(ulong *)(lVar11 + 0x28)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)
                   (((this->_imp)._M_t.
                     super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                     .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                   proof_stream)._M_t,"p",1);
        p_Var6 = *(_Rb_tree_node_base **)(lVar11 + 0x18);
        local_60 = lVar11;
        if (p_Var6 != (_Rb_tree_node_base *)(lVar11 + 8)) {
          bVar14 = true;
          do {
            uVar2._M_t.
            super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
            .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
            _M_head_impl = (((this->_imp)._M_t.
                             super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                             .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)
                           ->proof_stream)._M_t;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)
                       uVar2._M_t.
                       super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                       ._M_head_impl," ",1);
            local_58._M_dataplus._M_p = (pointer)(long)(int)p_Var6[1]._M_color;
            std::
            map<long,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ::operator[](&((this->_imp)._M_t.
                           super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                           .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                          at_least_one_value_constraints,(key_type_conflict1 *)&local_58);
            std::ostream::_M_insert<long>
                      ((long)uVar2._M_t.
                             super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                             ._M_head_impl);
            if (!bVar14) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)
                         (((this->_imp)._M_t.
                           super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                           .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                         proof_stream)._M_t," +",2);
            }
            p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
            bVar14 = false;
          } while (p_Var6 != (_Rb_tree_node_base *)(lVar11 + 8));
        }
        p_Var6 = (_Rb_tree_node_base *)(local_60 + 0x38);
        for (p_Var8 = *(_Rb_tree_node_base **)(local_60 + 0x48); p_Var8 != p_Var6;
            p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
          uVar2._M_t.
          super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
          .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
          _M_head_impl = (((this->_imp)._M_t.
                           super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                           .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                         proof_stream)._M_t;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)
                     uVar2._M_t.
                     super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                     ._M_head_impl," ",1);
          local_58._M_dataplus._M_p = (pointer)(long)(int)p_Var8[1]._M_color;
          std::
          map<long,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::operator[](&((this->_imp)._M_t.
                         super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                         .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                        injectivity_constraints,(key_type_conflict1 *)&local_58);
          poVar7 = std::ostream::_M_insert<long>
                             ((long)uVar2._M_t.
                                    super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                                    ._M_head_impl);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," +",2);
        }
        local_58._M_dataplus._M_p._1_7_ = (undefined7)((ulong)local_58._M_dataplus._M_p >> 8);
        local_58._M_dataplus._M_p._0_1_ = 10;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)
                   (((this->_imp)._M_t.
                     super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                     .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                   proof_stream)._M_t,(char *)&local_58,1);
        _Var3._M_head_impl =
             (this->_imp)._M_t.
             super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
             ._M_t.
             super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
             .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
        __len = 1;
        uVar13 = (_Var3._M_head_impl)->proof_line + 1;
        (_Var3._M_head_impl)->proof_line = uVar13;
        __val = -uVar13;
        if (0 < (long)uVar13) {
          __val = uVar13;
        }
        if (9 < __val) {
          uVar10 = __val;
          uVar5 = 4;
          do {
            __len = uVar5;
            if (uVar10 < 100) {
              __len = __len - 2;
              goto LAB_0014e4b0;
            }
            if (uVar10 < 1000) {
              __len = __len - 1;
              goto LAB_0014e4b0;
            }
            if (uVar10 < 10000) goto LAB_0014e4b0;
            bVar14 = 99999 < uVar10;
            uVar10 = uVar10 / 10000;
            uVar5 = __len + 4;
          } while (bVar14);
          __len = __len + 1;
        }
LAB_0014e4b0:
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_construct(&local_58,(ulong)(__len - (int)((long)uVar13 >> 0x3f)),'-');
        std::__detail::__to_chars_10_impl<unsigned_long>
                  (local_58._M_dataplus._M_p + -((long)uVar13 >> 0x3f),__len,__val);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_78,
                   &local_58);
        lVar11 = local_60;
        lVar9 = local_38;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
          lVar9 = local_38;
        }
      }
      lVar11 = lVar11 + 0x60;
    } while (lVar11 != lVar9);
    if (local_78.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_78.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      uVar2._M_t.
      super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
      .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
      _M_head_impl = (((this->_imp)._M_t.
                       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                     proof_stream)._M_t;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)
                 uVar2._M_t.
                 super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                 .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
                 _M_head_impl,"p ",2);
      std::ostream::_M_insert<long>
                ((long)uVar2._M_t.
                       super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                       ._M_head_impl);
      pbVar4 = local_78.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar12 = local_78.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pbVar12 != pbVar4;
          pbVar12 = pbVar12 + 1) {
        uVar2._M_t.
        super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
        .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
        _M_head_impl = (((this->_imp)._M_t.
                         super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                         .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                       proof_stream)._M_t;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)
                   uVar2._M_t.
                   super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                   ._M_head_impl," ",1);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)
                            uVar2._M_t.
                            super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                            ._M_head_impl,(pbVar12->_M_dataplus)._M_p,pbVar12->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," +",2);
      }
      local_58._M_dataplus._M_p._1_7_ = (undefined7)((ulong)local_58._M_dataplus._M_p >> 8);
      local_58._M_dataplus._M_p._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)
                 (((this->_imp)._M_t.
                   super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                   .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                 proof_stream)._M_t,(char *)&local_58,1);
      plVar1 = &((this->_imp)._M_t.
                 super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                 .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->proof_line
      ;
      *plVar1 = *plVar1 + 1;
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_78);
  return;
}

Assistant:

auto Proof::mcs_bound(
    const vector<pair<set<int>, set<int>>> & partitions) -> void
{
    *_imp->proof_stream << "* failed bound\n";

    if (_imp->recover_encoding) {
        for (auto & [l, r] : partitions) {
            for (auto & v : r)
                recover_injectivity_constraint(v);
            for (auto & v : l)
                recover_at_least_one_constraint(v);
        }
    }

    vector<string> to_sum;
    for (auto & [l, r] : partitions) {
        if (r.size() >= l.size())
            continue;

        *_imp->proof_stream << "p";
        bool first = true;
        for (auto & v : l) {
            *_imp->proof_stream << " " << get<1>(_imp->at_least_one_value_constraints[v]);
            if (first)
                first = false;
            else
                *_imp->proof_stream << " +";
        }
        for (auto & v : r)
            *_imp->proof_stream << " " << get<1>(_imp->injectivity_constraints[v]) << " +";

        *_imp->proof_stream << '\n';
        to_sum.push_back(to_string(++_imp->proof_line));
    }

    if (! to_sum.empty()) {
        *_imp->proof_stream << "p " << _imp->objective_line;
        for (auto & t : to_sum)
            *_imp->proof_stream << " " << t << " +";
        *_imp->proof_stream << '\n';
        ++_imp->proof_line;
    }
}